

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void test_async_connect(void)

{
  ostream *poVar1;
  runtime_error *this;
  allocator local_259;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_258;
  io_service srv;
  allocator local_240 [32];
  stream_socket s2;
  acceptor acc;
  stream_socket s1;
  ostringstream oss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test async connect");
  std::endl<char,std::char_traits<char>>(poVar1);
  booster::aio::io_service::io_service(&srv);
  calls_no = 1;
  the_service = &srv;
  booster::aio::acceptor::acceptor(&acc,&srv);
  booster::aio::stream_socket::stream_socket(&s1,&srv);
  booster::aio::acceptor::open(&acc,1);
  booster::aio::basic_socket::set_option(&acc,2,1);
  std::__cxx11::string::string((string *)&oss,"127.0.0.1",local_240);
  booster::aio::endpoint::endpoint((endpoint *)&s2,(string *)&oss,0x1f90);
  booster::aio::acceptor::bind((endpoint *)&acc);
  booster::aio::endpoint::~endpoint((endpoint *)&s2);
  std::__cxx11::string::~string((string *)&oss);
  booster::aio::acceptor::listen((int)&acc);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            ((callback<void(std::error_code_const&)> *)&oss,async_accept_handler);
  booster::aio::acceptor::async_accept((stream_socket *)&acc,(callback *)&s1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&oss);
  booster::aio::stream_socket::stream_socket(&s2,&srv);
  booster::aio::stream_socket::open(&s2,1);
  std::__cxx11::string::string((string *)&oss,"127.0.0.1",&local_259);
  booster::aio::endpoint::endpoint((endpoint *)local_240,(string *)&oss,0x1f90);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            ((callback<void(std::error_code_const&)> *)&local_258,async_connect_handler);
  booster::aio::stream_socket::async_connect((endpoint *)&s2,(callback *)local_240);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_258);
  booster::aio::endpoint::~endpoint((endpoint *)local_240);
  std::__cxx11::string::~string((string *)&oss);
  booster::aio::io_service::run();
  if (calls_no == 6) {
    booster::aio::basic_io_device::set_non_blocking(SUB81(&s1,0));
    booster::aio::basic_io_device::set_non_blocking(SUB81(&s2,0));
    test_connected(&s1,&s2);
    booster::aio::stream_socket::~stream_socket(&s2);
    booster::aio::stream_socket::~stream_socket(&s1);
    booster::aio::acceptor::~acceptor(&acc);
    booster::aio::io_service::~io_service(&srv);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14f);
  std::operator<<(poVar1," calls_no == 6");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_240);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_async_connect()
{
	std::cout << "Test async connect" << std::endl;
	io::io_service srv;
	reset_glb(srv);
	io::acceptor acc(srv);
	io::stream_socket s1(srv);
	acc.open(io::pf_inet);
    #ifndef BOOSTER_WIN32
	acc.set_option(io::stream_socket::reuse_address,true);
    #endif
	acc.bind(io::endpoint("127.0.0.1",8080));
	acc.listen(1);
	acc.async_accept(s1,async_accept_handler);
	io::stream_socket s2(srv);
	s2.open(io::pf_inet);
	s2.async_connect(io::endpoint("127.0.0.1",8080),async_connect_handler);
	srv.run();
	TEST(calls_no == 6);
	s1.set_non_blocking(false);
	s2.set_non_blocking(false);
	test_connected(s1,s2);
}